

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_reduce.cpp
# Opt level: O0

void transform_reduce<tf::RandomPartitioner<tf::DefaultClosureWrapper>>(uint W)

{
  code *pcVar1;
  double dVar2;
  ulong uVar3;
  byte extraout_AL;
  byte extraout_AL_00;
  byte extraout_AL_01;
  size_type sVar4;
  undefined1 *__stat_loc;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  Expression_lhs<const_int_&> EVar5;
  ResultBuilder DOCTEST_RB_2;
  ResultBuilder DOCTEST_RB_1;
  ResultBuilder DOCTEST_RB;
  Task ptask;
  Task stask;
  iterator end;
  iterator beg;
  int pmin;
  int smin;
  size_t c;
  const_iterator __end2;
  const_iterator __begin2;
  initializer_list<int> *__range2;
  size_t n;
  vector<Data,_std::allocator<Data>_> vec;
  Taskflow taskflow;
  Executor executor;
  Result *in_stack_fffffffffffff9e8;
  Task *tasks;
  Result *pRVar6;
  undefined4 in_stack_fffffffffffff9f0;
  undefined4 in_stack_fffffffffffff9f4;
  Executor *this;
  int line;
  allocator_type *in_stack_fffffffffffffa00;
  undefined4 in_stack_fffffffffffffa08;
  Enum in_stack_fffffffffffffa0c;
  Taskflow *in_stack_fffffffffffffa10;
  Executor *in_stack_fffffffffffffa20;
  anon_class_40_5_697928ac *in_stack_fffffffffffffa30;
  FlowBuilder *in_stack_fffffffffffffa38;
  Taskflow *in_stack_fffffffffffffa70;
  Enum in_stack_fffffffffffffa78;
  undefined4 in_stack_fffffffffffffa7c;
  ExpressionDecomposer local_57c;
  Taskflow *local_578;
  Enum local_570;
  shared_ptr<tf::WorkerInterface> *in_stack_fffffffffffffad8;
  size_t in_stack_fffffffffffffae0;
  undefined8 in_stack_fffffffffffffae8;
  ExpressionDecomposer local_4b4;
  Executor *local_4b0;
  Enum local_4a8;
  ResultBuilder local_480;
  int local_404;
  anon_class_40_5_697928ac *local_400;
  Enum local_3f8;
  ExpressionDecomposer local_3ec;
  anon_class_40_5_697928ac *local_3e8;
  Enum local_3e0;
  ResultBuilder local_3b8;
  __basic_future<void> local_340 [2];
  undefined4 local_320;
  undefined4 uStack_31c;
  undefined4 uStack_318;
  undefined4 uStack_314;
  Executor *local_310;
  __normal_iterator<Data_*,_std::vector<Data,_std::allocator<Data>_>_> *local_300;
  __normal_iterator<Data_*,_std::vector<Data,_std::allocator<Data>_>_> *local_2f8;
  FlowBuilder local_2f0;
  FlowBuilder local_2e8;
  Data **local_2e0;
  vector<Data,_std::allocator<Data>_> *local_2d8;
  Data **local_2d0;
  ulong *local_2c8;
  int *local_2c0;
  Data *local_2b0;
  Data *local_2a8;
  int local_2a0;
  int local_29c;
  long local_298;
  int *local_290;
  int *local_288;
  int local_27c [5];
  initializer_list<int> local_268;
  initializer_list<int> *local_258;
  ulong local_250 [2];
  vector<Data,_std::allocator<Data>_> local_240;
  undefined1 local_228 [232];
  undefined1 local_140 [320];
  
  std::shared_ptr<tf::WorkerInterface>::shared_ptr
            ((shared_ptr<tf::WorkerInterface> *)
             CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),in_stack_fffffffffffff9e8
            );
  tf::Executor::Executor
            ((Executor *)in_stack_fffffffffffffae8,in_stack_fffffffffffffae0,
             in_stack_fffffffffffffad8);
  std::shared_ptr<tf::WorkerInterface>::~shared_ptr((shared_ptr<tf::WorkerInterface> *)0x19631c);
  tf::Taskflow::Taskflow(in_stack_fffffffffffffa10);
  std::allocator<Data>::allocator((allocator<Data> *)0x19633d);
  std::vector<Data,_std::allocator<Data>_>::vector
            ((vector<Data,_std::allocator<Data>_> *)in_stack_fffffffffffffa10,
             CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08),in_stack_fffffffffffffa00
            );
  std::allocator<Data>::~allocator((allocator<Data> *)0x196363);
  local_250[0] = 1;
  do {
    uVar3 = local_250[0];
    sVar4 = std::vector<Data,_std::allocator<Data>_>::size(&local_240);
    if (sVar4 <= uVar3) {
      std::vector<Data,_std::allocator<Data>_>::~vector
                ((vector<Data,_std::allocator<Data>_> *)in_stack_fffffffffffffa00);
      tf::Taskflow::~Taskflow
                ((Taskflow *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
      tf::Executor::~Executor(in_stack_fffffffffffffa20);
      return;
    }
    local_27c[0] = 0;
    local_27c[1] = 1;
    local_27c[2] = 3;
    local_27c[3] = 7;
    local_27c[4] = 99;
    local_268._M_array = local_27c;
    local_268._M_len = 5;
    local_258 = &local_268;
    local_288 = std::initializer_list<int>::begin(local_258);
    local_290 = std::initializer_list<int>::end
                          ((initializer_list<int> *)
                           CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
    for (; local_288 != local_290; local_288 = local_288 + 1) {
      local_298 = (long)*local_288;
      local_29c = std::numeric_limits<int>::max();
      local_2a0 = std::numeric_limits<int>::max();
      local_2a8 = (Data *)std::vector<Data,_std::allocator<Data>_>::end
                                    ((vector<Data,_std::allocator<Data>_> *)
                                     in_stack_fffffffffffff9e8);
      local_2b0 = (Data *)std::vector<Data,_std::allocator<Data>_>::end
                                    ((vector<Data,_std::allocator<Data>_> *)
                                     in_stack_fffffffffffff9e8);
      tf::Taskflow::clear((Taskflow *)0x19649a);
      local_2e0 = &local_2a8;
      local_2d0 = &local_2b0;
      local_2c8 = local_250;
      local_2c0 = &local_29c;
      local_2d8 = &local_240;
      tf::FlowBuilder::
      emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_reduce_cpp:620:37),_nullptr>
                (in_stack_fffffffffffffa38,in_stack_fffffffffffffa30);
      tf::Task::Task((Task *)&local_2e8);
      local_2f8 = (__normal_iterator<Data_*,_std::vector<Data,_std::allocator<Data>_>_> *)
                  std::
                  ref<__gnu_cxx::__normal_iterator<Data*,std::vector<Data,std::allocator<Data>>>>
                            ((__normal_iterator<Data_*,_std::vector<Data,_std::allocator<Data>_>_> *
                             )in_stack_fffffffffffff9e8);
      local_300 = (__normal_iterator<Data_*,_std::vector<Data,_std::allocator<Data>_>_> *)
                  std::
                  ref<__gnu_cxx::__normal_iterator<Data*,std::vector<Data,std::allocator<Data>>>>
                            ((__normal_iterator<Data_*,_std::vector<Data,_std::allocator<Data>_>_> *
                             )in_stack_fffffffffffff9e8);
      tf::RandomPartitioner<tf::DefaultClosureWrapper>::RandomPartitioner
                ((RandomPartitioner<tf::DefaultClosureWrapper> *)
                 CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
                 (size_t)in_stack_fffffffffffff9e8);
      tasks = (Task *)CONCAT44(uStack_31c,local_320);
      in_stack_fffffffffffff9f0 = uStack_318;
      in_stack_fffffffffffff9f4 = uStack_314;
      this = local_310;
      tf::FlowBuilder::
      transform_reduce<std::reference_wrapper<__gnu_cxx::__normal_iterator<Data_*,_std::vector<Data,_std::allocator<Data>_>_>_>,_std::reference_wrapper<__gnu_cxx::__normal_iterator<Data_*,_std::vector<Data,_std::allocator<Data>_>_>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_reduce_cpp:632:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_reduce_cpp:633:9),_tf::RandomPartitioner<tf::DefaultClosureWrapper>,_nullptr>
                (&local_2f0,local_228,local_2f8,local_300,&local_2a0);
      in_stack_fffffffffffffa38 = &local_2e8;
      tf::Task::operator=((Task *)in_stack_fffffffffffffa38,(Task *)&local_2f0);
      tf::Task::precede<tf::Task&>
                ((Task *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),tasks);
      __stat_loc = local_140;
      tf::Executor::run(this,(Taskflow *)
                             CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
      line = (int)((ulong)this >> 0x20);
      std::__basic_future<void>::wait(local_340,__stat_loc);
      tf::Future<void>::~Future
                ((Future<void> *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
      pRVar6 = (Result *)0x2150c5;
      doctest::detail::ResultBuilder::ResultBuilder
                ((ResultBuilder *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,
                 (char *)in_stack_fffffffffffffa00,line,
                 (char *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),"",
                 (char *)in_stack_fffffffffffffa20);
      doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_3ec,DT_REQUIRE);
      EVar5 = doctest::detail::ExpressionDecomposer::operator<<<int,_nullptr>
                        ((ExpressionDecomposer *)
                         CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),(int *)pRVar6
                        );
      in_stack_fffffffffffffa30 = (anon_class_40_5_697928ac *)EVar5.lhs;
      local_3f8 = EVar5.m_at;
      local_400 = in_stack_fffffffffffffa30;
      local_3e8 = in_stack_fffffffffffffa30;
      local_3e0 = local_3f8;
      local_404 = std::numeric_limits<int>::max();
      doctest::detail::Expression_lhs<int_const&>::operator!=
                ((Expression_lhs<const_int_&> *)
                 CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),
                 (int *)in_stack_fffffffffffffa70);
      doctest::detail::ResultBuilder::setResult
                ((ResultBuilder *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
                 pRVar6);
      doctest::detail::Result::~Result((Result *)0x1966f0);
      dVar2 = doctest::detail::ResultBuilder::log
                        (&local_3b8,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
      if ((extraout_AL & 1) != 0) {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      doctest::detail::ResultBuilder::react
                ((ResultBuilder *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
      doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x19686a);
      pRVar6 = (Result *)0x2150c5;
      doctest::detail::ResultBuilder::ResultBuilder
                ((ResultBuilder *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,
                 (char *)in_stack_fffffffffffffa00,line,
                 (char *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),"",
                 (char *)in_stack_fffffffffffffa20);
      doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_4b4,DT_REQUIRE);
      EVar5 = doctest::detail::ExpressionDecomposer::operator<<<int,_nullptr>
                        ((ExpressionDecomposer *)
                         CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),(int *)pRVar6
                        );
      in_stack_fffffffffffffa20 = (Executor *)EVar5.lhs;
      local_4a8 = EVar5.m_at;
      local_4b0 = in_stack_fffffffffffffa20;
      std::numeric_limits<int>::max();
      doctest::detail::Expression_lhs<int_const&>::operator!=
                ((Expression_lhs<const_int_&> *)
                 CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),
                 (int *)in_stack_fffffffffffffa70);
      doctest::detail::ResultBuilder::setResult
                ((ResultBuilder *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
                 pRVar6);
      doctest::detail::Result::~Result((Result *)0x19695b);
      dVar2 = doctest::detail::ResultBuilder::log
                        (&local_480,(double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
      if ((extraout_AL_00 & 1) != 0) {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      doctest::detail::ResultBuilder::react
                ((ResultBuilder *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
      doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x196a40);
      in_stack_fffffffffffff9e8 = (Result *)0x2150c5;
      doctest::detail::ResultBuilder::ResultBuilder
                ((ResultBuilder *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,
                 (char *)in_stack_fffffffffffffa00,line,
                 (char *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),"",
                 (char *)in_stack_fffffffffffffa20);
      doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_57c,DT_REQUIRE);
      EVar5 = doctest::detail::ExpressionDecomposer::operator<<<int,_nullptr>
                        ((ExpressionDecomposer *)
                         CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
                         (int *)in_stack_fffffffffffff9e8);
      in_stack_fffffffffffffa10 = (Taskflow *)EVar5.lhs;
      in_stack_fffffffffffffa0c = EVar5.m_at;
      in_stack_fffffffffffffa70 = in_stack_fffffffffffffa10;
      in_stack_fffffffffffffa78 = in_stack_fffffffffffffa0c;
      local_578 = in_stack_fffffffffffffa10;
      local_570 = in_stack_fffffffffffffa0c;
      doctest::detail::Expression_lhs<const_int_&>::operator==<int,_nullptr>
                ((Expression_lhs<const_int_&> *)
                 CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa0c),
                 (int *)in_stack_fffffffffffffa10);
      doctest::detail::ResultBuilder::setResult
                ((ResultBuilder *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
                 in_stack_fffffffffffff9e8);
      doctest::detail::Result::~Result((Result *)0x196b25);
      dVar2 = doctest::detail::ResultBuilder::log
                        ((ResultBuilder *)&stack0xfffffffffffffab8,
                         (double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01));
      if ((extraout_AL_01 & 1) != 0) {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      doctest::detail::ResultBuilder::react
                ((ResultBuilder *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
      doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x196c04);
    }
    local_250[0] = local_250[0] + 1;
  } while( true );
}

Assistant:

void transform_reduce(unsigned W) {

  tf::Executor executor(W);
  tf::Taskflow taskflow;

  std::vector<Data> vec(1000);

  for(size_t n=1; n<vec.size(); n++) {
    for(size_t c : {0, 1, 3, 7, 99}) {

      int smin = std::numeric_limits<int>::max();
      int pmin = std::numeric_limits<int>::max();
      auto beg = vec.end();
      auto end = vec.end();

      taskflow.clear();
      auto stask = taskflow.emplace([&](){
        beg = vec.begin();
        end = vec.begin() + n;
        for(auto itr = beg; itr != end; itr++) {
          smin = std::min(itr->get(), smin);
        }
      });

      tf::Task ptask;

      ptask = taskflow.transform_reduce(
        std::ref(beg), std::ref(end), pmin,
        [] (int l, int r)   { return std::min(l, r); },
        [] (const Data& data) { return data.get(); },
        P(c)
      );

      stask.precede(ptask);

      executor.run(taskflow).wait();

      REQUIRE(smin != std::numeric_limits<int>::max());
      REQUIRE(pmin != std::numeric_limits<int>::max());
      REQUIRE(smin == pmin);
    }
  }
}